

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O2

void luaL_addvalue(luaL_Buffer *B)

{
  lua_State *L;
  int iVar1;
  char *__src;
  size_t vl;
  
  L = B->L;
  __src = lua_tolstring(L,-1,&vl);
  if ((ulong)((long)B + (0x2018 - (long)B->p)) < vl) {
    iVar1 = emptybuffer(B);
    if (iVar1 != 0) {
      lua_insert(L,-2);
    }
    B->lvl = B->lvl + 1;
    adjuststack(B);
  }
  else {
    memcpy(B->p,__src,vl);
    B->p = B->p + vl;
    lua_settop(L,-2);
  }
  return;
}

Assistant:

LUALIB_API void luaL_addvalue(luaL_Buffer *B)
{
  lua_State *L = B->L;
  size_t vl;
  const char *s = lua_tolstring(L, -1, &vl);
  if (vl <= bufffree(B)) {  /* fit into buffer? */
    memcpy(B->p, s, vl);  /* put it there */
    B->p += vl;
    lua_pop(L, 1);  /* remove from stack */
  } else {
    if (emptybuffer(B))
      lua_insert(L, -2);  /* put buffer before new value */
    B->lvl++;  /* add new value into B stack */
    adjuststack(B);
  }
}